

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O1

TableUpdateState * __thiscall
duckdb::UpdateLocalState::GetUpdateState
          (UpdateLocalState *this,DataTable *table,TableCatalogEntry *tableref,
          ClientContext *context)

{
  _Head_base<0UL,_duckdb::TableUpdateState_*,_false> __ptr;
  _Head_base<0UL,_duckdb::TableUpdateState_*,_false> _Var1;
  type pTVar2;
  _Head_base<0UL,_duckdb::TableUpdateState_*,_false> local_20;
  
  if ((this->update_state).
      super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
      .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl ==
      (TableUpdateState *)0x0) {
    DataTable::InitializeUpdate
              ((DataTable *)&stack0xffffffffffffffe0,(TableCatalogEntry *)table,
               (ClientContext *)tableref,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)context);
    _Var1._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (TableUpdateState *)0x0;
    __ptr._M_head_impl =
         (this->update_state).
         super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
         .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl;
    (this->update_state).
    super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
    .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (__ptr._M_head_impl != (TableUpdateState *)0x0) {
      ::std::default_delete<duckdb::TableUpdateState>::operator()
                ((default_delete<duckdb::TableUpdateState> *)&this->update_state,__ptr._M_head_impl)
      ;
    }
    if ((element_type *)local_20._M_head_impl != (element_type *)0x0) {
      ::std::default_delete<duckdb::TableUpdateState>::operator()
                ((default_delete<duckdb::TableUpdateState> *)&stack0xffffffffffffffe0,
                 local_20._M_head_impl);
    }
  }
  pTVar2 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
           ::operator*(&this->update_state);
  return pTVar2;
}

Assistant:

TableUpdateState &GetUpdateState(DataTable &table, TableCatalogEntry &tableref, ClientContext &context) {
		if (!update_state) {
			update_state = table.InitializeUpdate(tableref, context, bound_constraints);
		}
		return *update_state;
	}